

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall ot::commissioner::coap::Coap::RequestsCache::UpdateTimer(RequestsCache *this)

{
  TimePoint TVar1;
  
  if ((this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    Timer::Stop(&this->mRetransmissionTimer);
    return;
  }
  if ((this->mRetransmissionTimer).mEnabled == true) {
    TVar1 = Earliest(this);
    if ((this->mRetransmissionTimer).mFireTime.__d.__r <= (long)TVar1.__d.__r) {
      return;
    }
  }
  TVar1 = Earliest(this);
  Timer::Start(&this->mRetransmissionTimer,TVar1);
  return;
}

Assistant:

void Coap::RequestsCache::UpdateTimer()
{
    if (IsEmpty())
    {
        mRetransmissionTimer.Stop();
    }
    else if (!mRetransmissionTimer.IsRunning() || Earliest() < mRetransmissionTimer.GetFireTime())
    {
        mRetransmissionTimer.Start(Earliest());
    }
}